

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_read_pcm_frames_s32be
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int32 *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  ma_uint64 mVar3;
  ma_dr_wav *in_RDX;
  long in_RDI;
  ma_uint64 framesRead;
  ma_uint64 iSample;
  ma_int32 *in_stack_ffffffffffffffb8;
  ma_uint64 in_stack_ffffffffffffffc0;
  ulong local_20;
  
  mVar3 = ma_dr_wav_read_pcm_frames_s32(in_RDX,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_RDX != (ma_dr_wav *)0x0) {
    uVar1 = *(ushort *)(in_RDI + 0x70);
    for (local_20 = 0; local_20 < mVar3 * uVar1; local_20 = local_20 + 1) {
      uVar2 = *(uint *)((in_RDX->fmt).subFormat + local_20 * 4 + -0x5c);
      *(uint *)((in_RDX->fmt).subFormat + local_20 * 4 + -0x5c) =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s32be(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int32* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_s32(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && ma_dr_wav__is_little_endian() == MA_TRUE) {
        ma_dr_wav__bswap_samples_s32(pBufferOut, framesRead*pWav->channels);
    }
    return framesRead;
}